

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_cp_setfromcox(jpc_dec_cp_t *cp,jpc_dec_ccp_t *ccp,jpc_coxcp_t *compparms,int flags)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  
  iVar3 = (int)in_RAX;
  if ((((ulong)compparms & 4) != 0) || ((cp->flags & 4) == 0)) {
    *(uint_fast8_t *)&cp->pchglist = ccp->numrlvls;
    lVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),ccp->csty);
    *(uint_fast8_t *)((long)&cp[0x11].pchglist + 2) = ccp->csty;
    uVar1 = ccp->flags;
    *(uint *)&cp->field_0x4 =
         uVar1 & 1 |
         (uint)CONCAT12((char)(uVar1 >> 0x18) + '\x02',
                        CONCAT11((char)(uVar1 >> 0x10) + '\x02',(char)(uVar1 >> 8) + '\x01')) << 8;
    iVar3._0_1_ = ccp->qmfbid;
    iVar3._1_1_ = ccp->qsty;
    iVar3._2_2_ = *(undefined2 *)&ccp->field_0xa;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        *(undefined1 *)((long)&cp[0x11].pchglist + lVar4 + 3) =
             *(undefined1 *)((long)ccp->stepsizes + lVar4 * 2 + -0xc);
        *(undefined1 *)((long)&cp[0x11].ccps + lVar4 + 4) =
             *(undefined1 *)((long)ccp->stepsizes + lVar4 * 2 + -0xb);
        lVar4 = lVar4 + 1;
        iVar2._0_1_ = ccp->qmfbid;
        iVar2._1_1_ = ccp->qsty;
        iVar2._2_2_ = *(undefined2 *)&ccp->field_0xa;
      } while (lVar4 < iVar2);
    }
    iVar3 = (int)lVar4;
    cp->flags = (uint)compparms | cp->flags | 1;
  }
  return iVar3;
}

Assistant:

static int jpc_dec_cp_setfromcox(jpc_dec_cp_t *cp, jpc_dec_ccp_t *ccp,
  jpc_coxcp_t *compparms, int flags)
{
	int rlvlno;

	/* Eliminate compiler warnings about unused variables. */
	(void)cp;

	if ((flags & JPC_COC) || !(ccp->flags & JPC_COC)) {
		ccp->numrlvls = compparms->numdlvls + 1;
		ccp->cblkwidthexpn = JPC_COX_GETCBLKSIZEEXPN(
		  compparms->cblkwidthval);
		ccp->cblkheightexpn = JPC_COX_GETCBLKSIZEEXPN(
		  compparms->cblkheightval);
		ccp->qmfbid = compparms->qmfbid;
		ccp->cblkctx = compparms->cblksty;
		ccp->csty = compparms->csty & JPC_COX_PRT;
		for (rlvlno = 0; rlvlno < compparms->numrlvls; ++rlvlno) {
			ccp->prcwidthexpns[rlvlno] =
			  compparms->rlvls[rlvlno].parwidthval;
			ccp->prcheightexpns[rlvlno] =
			  compparms->rlvls[rlvlno].parheightval;
		}
		ccp->flags |= flags | JPC_CSET;
	}
	return 0;
}